

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  squirrel_error *e;
  int n_1;
  undefined1 local_150 [8];
  Coroutine co_2;
  int n;
  undefined1 local_110 [8];
  Coroutine co_1;
  string local_f0 [32];
  undefined1 local_d0 [8];
  Coroutine co;
  string local_b0 [32];
  Coroutine local_90;
  undefined1 local_68 [8];
  VMStd vm;
  
  vm.super_VM.root_table_._M_t.
  super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
  super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
  super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl._4_4_ = 0;
  squall::VMStd::VMStd((VMStd *)local_68,0x400);
  squall::VMStd::dofile((VMStd *)local_68,"coroutine.nut");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"bar",(allocator *)&co.field_0x17);
  squall::VM::co_call<int,int,int,int>(&local_90,(VM *)local_68,(string *)local_b0,1,2,3,4);
  squall::Coroutine::~Coroutine(&local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&co.field_0x17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"zot",(allocator *)&co_1.field_0x17);
  squall::VM::co_call<>((Coroutine *)local_d0,(VM *)local_68,(string *)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&co_1.field_0x17);
  while( true ) {
    bVar1 = squall::Coroutine::suspended((Coroutine *)local_d0);
    if (!bVar1) break;
    squall::Coroutine::resume((Coroutine *)local_d0);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"**** zot result: ");
  iVar2 = squall::Coroutine::result<int>((Coroutine *)local_d0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  squall::Coroutine::~Coroutine((Coroutine *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&n,"baz",(allocator *)&co_2.field_0x17);
  squall::VM::co_call<>((Coroutine *)local_110,(VM *)local_68,(string *)&n);
  std::__cxx11::string::~string((string *)&n);
  std::allocator<char>::~allocator((allocator<char> *)&co_2.field_0x17);
  while( true ) {
    bVar1 = squall::Coroutine::suspended((Coroutine *)local_110);
    if (!bVar1) break;
    co_2._16_4_ = squall::Coroutine::yielded<int>((Coroutine *)local_110);
    poVar3 = std::operator<<((ostream *)&std::cerr,"**** baz yielded: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,co_2._16_4_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    squall::Coroutine::resume((Coroutine *)local_110);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"**** baz result: ");
  iVar2 = squall::Coroutine::result<int>((Coroutine *)local_110);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  squall::Coroutine::~Coroutine((Coroutine *)local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&n_1,"foo",(allocator *)((long)&e + 7));
  squall::VM::co_call<>((Coroutine *)local_150,(VM *)local_68,(string *)&n_1);
  std::__cxx11::string::~string((string *)&n_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  while( true ) {
    bVar1 = squall::Coroutine::suspended((Coroutine *)local_150);
    if (!bVar1) break;
    e._0_4_ = squall::Coroutine::yielded<int>((Coroutine *)local_150);
    poVar3 = std::operator<<((ostream *)&std::cerr,"**** foo yielded: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)e);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    squall::Coroutine::resume<int>((Coroutine *)local_150,(int)e * 2);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"**** foo result: ");
  iVar2 = squall::Coroutine::result<int>((Coroutine *)local_150);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  squall::Coroutine::~Coroutine((Coroutine *)local_150);
  squall::VMStd::~VMStd((VMStd *)local_68);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("coroutine.nut");

        vm.co_call("bar", 1, 2, 3, 4);

        {
            auto co = vm.co_call("zot");
            while (co.suspended()) {
                co.resume();
            }
            std::cerr << "**** zot result: " << co.result<int>() << std::endl;
        }

        {
            auto co = vm.co_call("baz");
            while (co.suspended()) {
                int n = co.yielded<int>();
                std::cerr << "**** baz yielded: " << n << std::endl;
                co.resume();
            }
            std::cerr << "**** baz result: " << co.result<int>() << std::endl;
        }

        {
            auto co = vm.co_call("foo");
            while (co.suspended()) {
                int n = co.yielded<int>();
                std::cerr << "**** foo yielded: " << n << std::endl;
                co.resume(n*2);
            }
            std::cerr << "**** foo result: " << co.result<int>() << std::endl;
        }
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}